

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Matrix<Finite> getMatrix<Finite>(string *prompt)

{
  string *this;
  ostream *poVar1;
  istream *piVar2;
  matrix_error *this_00;
  Finite *extraout_RDX;
  uint height;
  string *in_RSI;
  uint uVar3;
  uint width;
  Matrix<Finite> MVar4;
  allocator local_259;
  string *local_258;
  string s;
  Finite dummy;
  string sum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  istringstream is;
  string local_1a0 [368];
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  sum._M_dataplus._M_p = (pointer)&sum.field_2;
  sum._M_string_length = 0;
  sum.field_2._M_local_buf[0] = '\0';
  poVar1 = std::operator<<((ostream *)&std::cout,in_RSI);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&dummy,"",(allocator *)&local_1f0);
  local_258 = prompt;
  safeGetline((string *)&is,(string *)&dummy);
  std::__cxx11::string::operator=((string *)&s,(string *)&is);
  std::__cxx11::string::~string((string *)&is);
  std::__cxx11::string::~string((string *)&dummy);
  width = 0;
  height = 0;
  do {
    if (s._M_string_length == 0) break;
    std::__cxx11::istringstream::istringstream((istringstream *)&is);
    std::__cxx11::stringbuf::str(local_1a0);
    Finite::Finite(&dummy);
    uVar3 = 0;
    while( true ) {
      piVar2 = operator>>((istream *)&is,&dummy);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      uVar3 = uVar3 + 1;
    }
    if (uVar3 != 0) {
      if (width != uVar3 && width != 0) {
        this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
        matrix_error::runtime_error(this_00,"Incorrect matrix");
        __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::operator+(&local_1f0,&s,' ');
      std::__cxx11::string::append((string *)&sum);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::string((string *)&local_1d0,"",&local_259);
      _readline(&local_1f0,&local_1d0);
      height = height + 1;
      std::__cxx11::string::operator=((string *)&s,(string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1d0);
      width = uVar3;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&dummy);
    std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  } while (uVar3 != 0);
  this = local_258;
  Matrix<Finite>::Matrix((Matrix<Finite> *)local_258,height,width);
  std::__cxx11::istringstream::istringstream((istringstream *)&is);
  std::__cxx11::stringbuf::str(local_1a0);
  Matrix<Finite>::_read_from_istream((Matrix<Finite> *)this,(istream *)&is);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::~string((string *)&sum);
  std::__cxx11::string::~string((string *)&s);
  MVar4.arr = extraout_RDX;
  MVar4._0_8_ = this;
  return MVar4;
}

Assistant:

Matrix<Field> getMatrix(string prompt)
{
    string s, sum;
    cout << prompt << endl;
    s = safeGetline();
    unsigned width = 0, height = 0;
    while(s.length())
    {
        istringstream is;
        is.str(s);
        unsigned cwidth = 0;
        Field dummy;
        while(is >> dummy)
            ++cwidth;
        if(!cwidth)
            break;
        if(width && width != cwidth)
            throw matrix_error("Incorrect matrix");
        width = cwidth;
        ++height;
        sum += s + ' ';
        s = _readline();
    }
    Matrix<Field> m(height, width);
    istringstream is;
    is.str(sum);
    is >> m;
    return m;
}